

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_object.cpp
# Opt level: O2

void __thiscall JsonObject_BadNestedObject_Test::TestBody(JsonObject_BadNestedObject_Test *this)

{
  parser<pstore::json::null_output> *this_00;
  char *message;
  AssertHelper AStack_d8;
  error_code local_d0;
  AssertionResult gtest_ar;
  parser<pstore::json::null_output> p;
  
  pstore::json::parser<pstore::json::null_output>::parser(&p,0);
  std::__cxx11::string::string((string *)&gtest_ar,"{\"a\":nu}",(allocator *)&local_d0);
  this_00 = pstore::json::parser<pstore::json::null_output>::input(&p,(string *)&gtest_ar);
  pstore::json::parser<pstore::json::null_output>::eof(this_00);
  std::__cxx11::string::~string((string *)&gtest_ar);
  local_d0._M_cat = pstore::json::get_error_category();
  local_d0._M_value = 0xb;
  testing::internal::CmpHelperEQ<std::error_code,std::error_code>
            ((internal *)&gtest_ar,"p.last_error ()",
             "make_error_code (json::error_code::unrecognized_token)",&p.error_,&local_d0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_d0);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      message = "";
    }
    else {
      message = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_object.cpp"
               ,0xbe,message);
    testing::internal::AssertHelper::operator=(&AStack_d8,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&AStack_d8);
    if ((long *)CONCAT44(local_d0._4_4_,local_d0._M_value) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_d0._4_4_,local_d0._M_value) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  pstore::json::parser<pstore::json::null_output>::~parser(&p);
  return;
}

Assistant:

TEST_F (JsonObject, BadNestedObject) {
    json::parser<json::null_output> p;
    p.input (std::string{"{\"a\":nu}"}).eof ();
    EXPECT_EQ (p.last_error (), make_error_code (json::error_code::unrecognized_token));
}